

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
test::iu_FilePath_x_iutest_x_IsRootDirectory_Test::Body
          (iu_FilePath_x_iutest_x_IsRootDirectory_Test *this)

{
  char *in_R9;
  string local_228;
  AssertionResult iutest_ar;
  FilePath path;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::detail::iuFilePath::iuFilePath(&path);
  if (path.m_path._M_string_length == 1) {
    iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_result = *path.m_path._M_dataplus._M_p != '/';
    if (!iutest_ar.m_result) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_228,(internal *)&iutest_ar,(AssertionResult *)"path.IsRootDirectory()",
                 "true","false",in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
                 ,0x4e,local_228._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_228);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
  }
  else {
    iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_result = true;
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&path);
  iutest::detail::iuFilePath::iuFilePath(&path,"path");
  if (path.m_path._M_string_length == 1) {
    iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_result = *path.m_path._M_dataplus._M_p != '/';
    if (!iutest_ar.m_result) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_228,(internal *)&iutest_ar,(AssertionResult *)"path.IsRootDirectory()",
                 "true","false",in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
                 ,0x52,local_228._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_228);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
  }
  else {
    iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_result = true;
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&path);
  iutest::detail::iuFilePath::iuFilePath(&path,"/");
  if (path.m_path._M_string_length == 1) {
    iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_result = *path.m_path._M_dataplus._M_p == '/';
    if (iutest_ar.m_result) goto LAB_0027787d;
  }
  else {
    iutest_ar.m_result = false;
  }
  iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_message._M_string_length = 0;
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            (&local_228,(internal *)&iutest_ar,(AssertionResult *)"path.IsRootDirectory()","false",
             "true",in_R9);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
             ,0x5a,local_228._M_dataplus._M_p);
  local_1c0._44_4_ = 1;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_228);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0027787d:
  std::__cxx11::string::~string((string *)&iutest_ar);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

IUTEST(FilePath, IsRootDirectory)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
        ::iutest::internal::FilePath path("path");
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
#ifdef IUTEST_OS_WINDOWS
        ::iutest::internal::FilePath path("C:\\");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#else
        ::iutest::internal::FilePath path("/");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#endif
    }
}